

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O3

string * __thiscall
t_d_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  _func_int *p_Var2;
  long lVar3;
  size_t __n;
  _Alloc_hider _Var4;
  t_d_generator *ptVar5;
  int iVar6;
  uint uVar7;
  t_const_value_type tVar8;
  t_type *ptVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  int64_t iVar12;
  ostringstream *this_00;
  _Rb_tree_header *p_Var13;
  t_type *ptVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  undefined4 extraout_var;
  long *plVar16;
  undefined4 extraout_var_00;
  size_type *psVar17;
  ulong uVar18;
  char *pcVar19;
  pointer pptVar20;
  t_type *ptVar21;
  _func_int **pp_Var22;
  bool bVar23;
  undefined1 auVar24 [12];
  string val;
  string val_1;
  ostringstream out;
  string local_220;
  t_d_generator *local_200;
  string local_1f8;
  string local_1d8;
  string *local_1b8;
  _Rb_tree_node_base *local_1b0;
  undefined1 local_1a8 [376];
  
  ptVar9 = t_type::get_true_type(type);
  this_00 = (ostringstream *)local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[5])(ptVar9);
  if ((char)iVar6 == '\0') {
    iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar6 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
      render_type_name_abi_cxx11_(&local_220,this,ptVar9,false);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," v;",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xb])();
      local_200 = this;
      local_1b8 = __return_storage_ptr__;
      if (((char)iVar6 == '\0') &&
         (iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])(), (char)iVar6 == '\0')) {
        iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0x10])();
        if ((char)iVar6 == '\0') {
          iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xe])();
          if ((char)iVar6 == '\0') {
            iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xf])();
            if ((char)iVar6 == '\0') {
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])();
              std::operator+(pbVar15,"Compiler error: Invalid type in render_const_value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar6));
              __cxa_throw(pbVar15,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            pptVar20 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar20 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar9 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
              do {
                ptVar5 = local_200;
                render_const_value_abi_cxx11_(&local_220,local_200,ptVar9,*pptVar20);
                poVar10 = t_generator::indent((t_generator *)ptVar5,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"v ~= ",5);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                pptVar20 = pptVar20 + 1;
              } while (pptVar20 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
          else {
            pptVar20 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar20 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar9 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
              do {
                ptVar5 = local_200;
                render_const_value_abi_cxx11_(&local_220,local_200,ptVar9,*pptVar20);
                poVar10 = t_generator::indent((t_generator *)ptVar5,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"v ~= ",5);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                pptVar20 = pptVar20 + 1;
              } while (pptVar20 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
        }
        else {
          p_Var11 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var13 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var11 != p_Var13) {
            ptVar21 = *(t_type **)&ptVar9[1].super_t_doc.has_doc_;
            ptVar9 = *(t_type **)&ptVar9[1].annotations_._M_t._M_impl;
            do {
              ptVar5 = local_200;
              render_const_value_abi_cxx11_
                        (&local_220,local_200,ptVar21,*(t_const_value **)(p_Var11 + 1));
              render_const_value_abi_cxx11_
                        (&local_1f8,ptVar5,ptVar9,(t_const_value *)p_Var11[1]._M_parent);
              poVar10 = t_generator::indent((t_generator *)ptVar5,(ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"v[",2);
              ptVar14 = t_type::get_true_type(ptVar21);
              iVar6 = (*(ptVar14->super_t_doc)._vptr_t_doc[5])(ptVar14);
              if (((char)iVar6 == '\0') &&
                 (iVar6 = (*(ptVar14->super_t_doc)._vptr_t_doc[10])(ptVar14), (char)iVar6 == '\0'))
              {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"cast(immutable(",0xf);
                render_type_name_abi_cxx11_(&local_1d8,local_200,ptVar21,false);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,
                                     local_1d8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"))",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p);
                }
              }
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                                   local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] = ",4);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
            } while ((_Rb_tree_header *)p_Var11 != p_Var13);
          }
        }
      }
      else {
        poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"v = ",4);
        uVar7 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])();
        pcVar19 = "";
        if ((char)uVar7 != '\0') {
          pcVar19 = "new ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,pcVar19,(ulong)((uVar7 & 0xff) << 2));
        render_type_name_abi_cxx11_(&local_220,this,ptVar9,false);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        p_Var11 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1b0 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (p_Var11 != local_1b0) {
          do {
            pp_Var22 = ptVar9[1].super_t_doc._vptr_t_doc;
            if (pp_Var22 == (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p) {
LAB_001af737:
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_1f8,"Type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar6));
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_220._M_dataplus._M_p = (pointer)*plVar16;
              psVar17 = (size_type *)(plVar16 + 2);
              if ((size_type *)local_220._M_dataplus._M_p == psVar17) {
                local_220.field_2._M_allocated_capacity = *psVar17;
                local_220.field_2._8_4_ = (undefined4)plVar16[3];
                local_220.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar17;
              }
              local_220._M_string_length = plVar16[1];
              *plVar16 = (long)psVar17;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              lVar3 = *(long *)(*(long *)(p_Var11 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,lVar3,*(long *)(*(long *)(p_Var11 + 1) + 0x50) + lVar3
                        );
              std::operator+(pbVar15,&local_220,&local_1d8);
              __cxa_throw(pbVar15,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar21 = (t_type *)0x0;
            do {
              p_Var2 = *pp_Var22;
              local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
              lVar3 = *(long *)(*(long *)(p_Var11 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,lVar3,*(long *)(*(long *)(p_Var11 + 1) + 0x50) + lVar3
                        );
              _Var4._M_p = local_220._M_dataplus._M_p;
              __n = *(size_t *)(p_Var2 + 0x70);
              if (__n == local_220._M_string_length) {
                if (__n == 0) {
                  bVar23 = true;
                }
                else {
                  iVar6 = bcmp(*(void **)(p_Var2 + 0x68),local_220._M_dataplus._M_p,__n);
                  bVar23 = iVar6 == 0;
                }
              }
              else {
                bVar23 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var4._M_p != &local_220.field_2) {
                operator_delete(_Var4._M_p);
              }
              ptVar5 = local_200;
              if (bVar23) {
                ptVar21 = *(t_type **)(*pp_Var22 + 0x60);
              }
              pp_Var22 = pp_Var22 + 1;
            } while (pp_Var22 != (_func_int **)ptVar9[1].super_t_doc.doc_._M_dataplus._M_p);
            if (ptVar21 == (t_type *)0x0) goto LAB_001af737;
            render_const_value_abi_cxx11_
                      (&local_220,local_200,ptVar21,(t_const_value *)p_Var11[1]._M_parent);
            poVar10 = t_generator::indent((t_generator *)ptVar5,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"v.set!`",7);
            lVar3 = *(long *)(*(long *)(p_Var11 + 1) + 0x48);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f8,lVar3,*(long *)(*(long *)(p_Var11 + 1) + 0x50) + lVar3);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`(",2);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while (p_Var11 != local_1b0);
        }
      }
      ptVar5 = local_200;
      poVar10 = t_generator::indent((t_generator *)local_200,(ostream *)local_1a8);
      __return_storage_ptr__ = local_1b8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"return v;",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(ptVar5->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar10 = t_generator::indent((t_generator *)ptVar5,(ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}()",3);
      goto LAB_001af381;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cast(",5);
    render_type_name_abi_cxx11_(&local_220,this,ptVar9,false);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)poVar10);
    goto LAB_001af2d3;
  }
  uVar7 = *(uint *)&ptVar9[1].super_t_doc._vptr_t_doc;
  switch(uVar7) {
  case 1:
    local_220._M_dataplus._M_p._0_1_ = 0x22;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_220,1);
    t_generator::get_escaped_string_abi_cxx11_(&local_220,(t_generator *)this,value);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_220._M_dataplus._M_p,local_220._M_string_length);
    local_1f8._M_dataplus._M_p._0_1_ = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_1f8,1);
    break;
  case 2:
    iVar12 = t_const_value::get_integer(value);
    pcVar19 = "false";
    if (0 < iVar12) {
      pcVar19 = "true";
    }
    uVar18 = (ulong)(0 < iVar12) ^ 5;
    goto LAB_001af33e;
  case 3:
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cast(",5);
    render_type_name_abi_cxx11_(&local_220,this,ptVar9,false);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)poVar10);
    break;
  case 5:
    goto switchD_001aedad_caseD_5;
  case 6:
    t_const_value::get_integer(value);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
    uVar18 = 1;
    pcVar19 = "L";
LAB_001af33e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar19,uVar18);
    goto LAB_001af381;
  case 7:
    tVar8 = t_const_value::get_type(value);
    if (tVar8 != CV_INTEGER) {
      std::ostream::_M_insert<double>(value->doubleVal_);
      goto LAB_001af381;
    }
    goto switchD_001aedad_caseD_5;
  default:
    auVar24 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar7,auVar24._8_4_);
    std::operator+(auVar24._0_8_,"Compiler error: No const of base type ",&local_220);
    __cxa_throw(auVar24._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
LAB_001af2d3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
LAB_001af381:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
switchD_001aedad_caseD_5:
  t_const_value::get_integer(value);
  std::ostream::_M_insert<long>((long)local_1a8);
  goto LAB_001af381;
}

Assistant:

string render_const_value(t_type* type, t_const_value* value) {
    // Resolve any typedefs.
    type = get_true_type(type);

    ostringstream out;
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_STRING:
        out << '"' << get_escaped_string(value) << '"';
        break;
      case t_base_type::TYPE_BOOL:
        out << ((value->get_integer() > 0) ? "true" : "false");
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
        out << "cast(" << render_type_name(type) << ")" << value->get_integer();
        break;
      case t_base_type::TYPE_I32:
        out << value->get_integer();
        break;
      case t_base_type::TYPE_I64:
        out << value->get_integer() << "L";
        break;
      case t_base_type::TYPE_DOUBLE:
        if (value->get_type() == t_const_value::CV_INTEGER) {
          out << value->get_integer();
        } else {
          out << value->get_double();
        }
        break;
      default:
        throw "Compiler error: No const of base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "cast(" << render_type_name(type) << ")" << value->get_integer();
    } else {
      out << "{" << endl;
      indent_up();

      indent(out) << render_type_name(type) << " v;" << endl;
      if (type->is_struct() || type->is_xception()) {
        indent(out) << "v = " << (type->is_xception() ? "new " : "") << render_type_name(type)
                    << "();" << endl;

        const vector<t_field*>& fields = ((t_struct*)type)->get_members();
        vector<t_field*>::const_iterator f_iter;
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          t_type* field_type = nullptr;
          for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
            if ((*f_iter)->get_name() == v_iter->first->get_string()) {
              field_type = (*f_iter)->get_type();
            }
          }
          if (field_type == nullptr) {
            throw "Type error: " + type->get_name() + " has no field "
                + v_iter->first->get_string();
          }
          string val = render_const_value(field_type, v_iter->second);
          indent(out) << "v.set!`" << v_iter->first->get_string() << "`(" << val << ");" << endl;
        }
      } else if (type->is_map()) {
        t_type* ktype = ((t_map*)type)->get_key_type();
        t_type* vtype = ((t_map*)type)->get_val_type();
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string key = render_const_value(ktype, v_iter->first);
          string val = render_const_value(vtype, v_iter->second);
          indent(out) << "v[";
          if (!is_immutable_type(ktype)) {
            out << "cast(immutable(" << render_type_name(ktype) << "))";
          }
          out << key << "] = " << val << ";" << endl;
        }
      } else if (type->is_list()) {
        t_type* etype = ((t_list*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else if (type->is_set()) {
        t_type* etype = ((t_set*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else {
        throw "Compiler error: Invalid type in render_const_value: " + type->get_name();
      }
      indent(out) << "return v;" << endl;

      indent_down();
      indent(out) << "}()";
    }

    return out.str();
  }